

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void blend_src_generic_fp(int count,QT_FT_Span *spans,void *userData)

{
  long in_FS_OFFSET;
  Operator op;
  char local_f8 [24];
  char *local_e0;
  Operator local_d8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_d8,&DAT_006ce8d0,0xb0);
  getOperator(&local_d8,(QSpanData *)userData,spans,count);
  if (((local_d8.funcFP == (CompositionFunctionFP)0x0) ||
      (local_d8.destFetchFP == (DestFetchProcFP)0x0)) ||
     (local_d8.srcFetchFP == (SourceFetchProcFP)0x0)) {
    lcQtGuiDrawHelper();
    if (((byte)lcQtGuiDrawHelper::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_f8[0] = '\x02';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = '\0';
      local_f8[9] = '\0';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_e0 = lcQtGuiDrawHelper::category.name;
      QMessageLogger::debug
                (local_f8,
                 "blend_src_generic_fp: unsupported 4xFP blend attempted, falling back to 32-bit");
    }
    handleSpans<BlendSrcGeneric>(count,spans,(QSpanData *)userData,&local_d8);
  }
  else {
    handleSpans<BlendSrcGenericRGBFP>(count,spans,(QSpanData *)userData,&local_d8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_src_generic_fp(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, spans, count);
    if (op.funcFP && op.destFetchFP && op.srcFetchFP) {
        handleSpans<BlendSrcGenericRGBFP>(count, spans, data, op);
    } else {
        qCDebug(lcQtGuiDrawHelper, "blend_src_generic_fp: unsupported 4xFP blend attempted, falling back to 32-bit");
        handleSpans<BlendSrcGeneric>(count, spans, data, op);
    }
}